

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

void __thiscall despot::POMCP::belief(POMCP *this,Belief *b)

{
  VNode *this_00;
  Belief *b_local;
  POMCP *this_local;
  
  (this->super_Solver).belief_ = b;
  History::Truncate(&(this->super_Solver).history_,0);
  (*this->prior_->_vptr_POMCPPrior[8])();
  this_00 = this->root_;
  if (this_00 != (VNode *)0x0) {
    VNode::~VNode(this_00);
    operator_delete(this_00,0x98);
  }
  this->root_ = (VNode *)0x0;
  return;
}

Assistant:

void POMCP::belief(Belief* b) {
	belief_ = b;
	history_.Truncate(0);
  prior_->PopAll();
	delete root_;
	root_ = NULL;
}